

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O1

bool __thiscall tinyusdz::Stage::replace_root_prim(Stage *this,string *prim_name,Prim *prim)

{
  multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar2;
  pointer pcVar3;
  size_t sVar4;
  string *__k;
  undefined8 __s2;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  size_type sVar8;
  ostream *poVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  key_type *__k_00;
  pointer pPVar10;
  char *pcVar11;
  pointer pPVar12;
  long lVar13;
  ulong uVar14;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar15;
  ostringstream ss_e;
  string local_220;
  pointer local_200;
  string *local_1f8;
  string local_1f0;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  pointer local_1b0;
  undefined1 local_1a8 [32];
  _Alloc_hider local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  _Alloc_hider local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8 [12];
  
  if (prim_name->_M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc",
               0x4f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"replace_root_prim",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar9 = (ostream *)std::ostream::operator<<((ostringstream *)local_1a8,699);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"prim_name is empty.","");
    fmt::format(&local_220,&local_1f0);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_220._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p == &local_220.field_2) goto LAB_0023f861;
  }
  else {
    bVar6 = ValidatePrimElementName(prim_name);
    if (bVar6) {
      this_00 = &this->_root_node_nameSet;
      local_1f8 = prim_name;
      if (((long)(this->_root_nodes).
                 super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->_root_nodes).
                 super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                 super__Vector_impl_data._M_start >> 4) * 0x21cfb2b78c13521d -
          (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase(&this_00->_M_t,
                   (_Link_type)
                   (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                  );
        p_Var1 = &(this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header;
        (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &p_Var1->_M_header;
        (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var1->_M_header;
        (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        pPVar10 = (this->_root_nodes).
                  super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                  super__Vector_impl_data._M_start;
        bVar6 = (this->_root_nodes).
                super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                super__Vector_impl_data._M_finish != pPVar10;
        if (bVar6) {
          lVar13 = 0x1a0;
          uVar14 = 0;
          do {
            if (*(long *)((long)&(pPVar10->_abs_path)._prim_part._M_string_length + lVar13) == 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                         ,0x4f);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"replace_root_prim",0x11);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar9 = (ostream *)std::ostream::operator<<((ostringstream *)local_1a8,0x2c7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
              pcVar11 = "Internal error: Existing root Prim\'s elementName is empty.";
              lVar13 = 0x3a;
LAB_0023fb3b:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,pcVar11,lVar13);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_220._M_dataplus._M_p)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._M_dataplus._M_p != &local_220.field_2) {
                operator_delete(local_220._M_dataplus._M_p,
                                local_220.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
              if (bVar6) {
                return false;
              }
              break;
            }
            sVar8 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&this_00->_M_t,
                            (key_type *)
                            ((long)&(pPVar10->_abs_path)._prim_part._M_dataplus._M_p + lVar13));
            if (sVar8 != 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                         ,0x4f);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"replace_root_prim",0x11);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar9 = (ostream *)std::ostream::operator<<((ostringstream *)local_1a8,0x2cb);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
              pcVar11 = "Internal error: Stage contains root Prim with same elementName.";
              lVar13 = 0x3f;
              goto LAB_0023fb3b;
            }
            __k_00 = (key_type *)
                     ((long)&(((this->_root_nodes).
                               super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
                               _M_impl.super__Vector_impl_data._M_start)->_abs_path)._prim_part +
                     lVar13);
            pVar15 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::_M_get_insert_equal_pos(&this_00->_M_t,__k_00);
            local_1a8._0_8_ = this_00;
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::
            _M_insert_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)this_00,pVar15.first,pVar15.second,__k_00,(_Alloc_node *)local_1a8);
            uVar14 = uVar14 + 1;
            pPVar10 = (this->_root_nodes).
                      super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar13 = lVar13 + 0x350;
            bVar6 = uVar14 < (ulong)(((long)(this->_root_nodes).
                                            super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pPVar10 >> 4) * 0x21cfb2b78c13521d);
          } while (bVar6);
        }
      }
      pPVar10 = (this->_root_nodes).
                super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                super__Vector_impl_data._M_start;
      pPVar12 = (this->_root_nodes).
                super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                super__Vector_impl_data._M_finish;
      local_1d0 = local_1c0;
      pcVar3 = (local_1f8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d0,pcVar3,pcVar3 + local_1f8->_M_string_length);
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f0,local_1d0,local_1c8 + (long)local_1d0);
      pmVar2 = (multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_1a8 + 0x10);
      local_1a8._0_8_ = pmVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,local_1f0._M_dataplus._M_p,
                 local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_220,local_1a8._0_8_,(pointer)(local_1a8._0_8_ + local_1a8._8_8_));
      if ((multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_1a8._0_8_ != pmVar2) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      local_1a8._0_8_ = pmVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,local_220._M_dataplus._M_p,
                 local_220._M_dataplus._M_p + local_220._M_string_length);
      uVar5 = local_1a8._8_8_;
      __s2 = local_1a8._0_8_;
      lVar13 = ((long)pPVar12 - (long)pPVar10 >> 4) * 0x21cfb2b78c13521d >> 2;
      local_200 = pPVar12;
      if (0 < lVar13) {
        local_1b0 = pPVar10 + lVar13 * 4;
        lVar13 = lVar13 + 1;
        pPVar12 = pPVar10 + 2;
        do {
          sVar4 = pPVar12[-2]._elementPath._prim_part._M_string_length;
          if ((sVar4 == uVar5) &&
             ((sVar4 == 0 ||
              (iVar7 = bcmp(pPVar12[-2]._elementPath._prim_part._M_dataplus._M_p,(void *)__s2,sVar4)
              , iVar7 == 0)))) {
            pPVar12 = pPVar12 + -2;
            goto LAB_0023fecd;
          }
          sVar4 = pPVar12[-1]._elementPath._prim_part._M_string_length;
          if ((sVar4 == uVar5) &&
             ((sVar4 == 0 ||
              (iVar7 = bcmp(pPVar12[-1]._elementPath._prim_part._M_dataplus._M_p,(void *)__s2,sVar4)
              , iVar7 == 0)))) {
            pPVar12 = pPVar12 + -1;
            goto LAB_0023fecd;
          }
          sVar4 = (pPVar12->_elementPath)._prim_part._M_string_length;
          if ((sVar4 == uVar5) &&
             ((sVar4 == 0 ||
              (iVar7 = bcmp((pPVar12->_elementPath)._prim_part._M_dataplus._M_p,(void *)__s2,sVar4),
              iVar7 == 0)))) goto LAB_0023fecd;
          sVar4 = pPVar12[1]._elementPath._prim_part._M_string_length;
          if ((sVar4 == uVar5) &&
             ((sVar4 == 0 ||
              (iVar7 = bcmp(pPVar12[1]._elementPath._prim_part._M_dataplus._M_p,(void *)__s2,sVar4),
              iVar7 == 0)))) {
            pPVar12 = pPVar12 + 1;
            goto LAB_0023fecd;
          }
          lVar13 = lVar13 + -1;
          pPVar12 = pPVar12 + 4;
          pPVar10 = local_1b0;
        } while (1 < lVar13);
      }
      lVar13 = ((long)local_200 - (long)pPVar10 >> 4) * 0x21cfb2b78c13521d;
      if (lVar13 == 1) {
LAB_0023fe68:
        sVar4 = (pPVar10->_elementPath)._prim_part._M_string_length;
        pPVar12 = local_200;
        if (((sVar4 == local_1a8._8_8_) && (pPVar12 = pPVar10, sVar4 != 0)) &&
           (iVar7 = bcmp((pPVar10->_elementPath)._prim_part._M_dataplus._M_p,(void *)local_1a8._0_8_
                         ,sVar4), iVar7 != 0)) {
          pPVar12 = local_200;
        }
      }
      else if (lVar13 == 2) {
LAB_0023fe2f:
        sVar4 = (pPVar10->_elementPath)._prim_part._M_string_length;
        if ((sVar4 != local_1a8._8_8_) ||
           ((pPVar12 = pPVar10, sVar4 != 0 &&
            (iVar7 = bcmp((pPVar10->_elementPath)._prim_part._M_dataplus._M_p,
                          (void *)local_1a8._0_8_,sVar4), iVar7 != 0)))) {
          pPVar10 = pPVar10 + 1;
          goto LAB_0023fe68;
        }
      }
      else {
        pPVar12 = local_200;
        if ((lVar13 == 3) &&
           ((sVar4 = (pPVar10->_elementPath)._prim_part._M_string_length, sVar4 != local_1a8._8_8_
            || ((pPVar12 = pPVar10, sVar4 != 0 &&
                (iVar7 = bcmp((pPVar10->_elementPath)._prim_part._M_dataplus._M_p,
                              (void *)local_1a8._0_8_,sVar4), iVar7 != 0)))))) {
          pPVar10 = pPVar10 + 1;
          goto LAB_0023fe2f;
        }
      }
LAB_0023fecd:
      if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_1a8._0_8_ !=
          (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)(local_1a8 + 0x10)) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if (local_1d0 != local_1c0) {
        operator_delete(local_1d0,local_1c0[0] + 1);
      }
      pPVar10 = (this->_root_nodes).
                super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                super__Vector_impl_data._M_finish;
      bVar6 = SetPrimElementName(&prim->_data,local_1f8);
      if (pPVar12 == pPVar10) {
        if (bVar6) {
          local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"");
          __k = local_1f8;
          Path::Path((Path *)local_1a8,local_1f8,&local_220);
          Path::operator=(&prim->_elementPath,(Path *)local_1a8);
          if (local_108._M_p != local_1a8 + 0xb0) {
            operator_delete(local_108._M_p,local_f8[0]._M_allocated_capacity + 1);
          }
          if (local_128._M_p != local_1a8 + 0x90) {
            operator_delete(local_128._M_p,local_118._M_allocated_capacity + 1);
          }
          if (local_148._M_p != local_1a8 + 0x70) {
            operator_delete(local_148._M_p,local_138._M_allocated_capacity + 1);
          }
          if (local_168._M_p != local_1a8 + 0x50) {
            operator_delete(local_168._M_p,local_158._M_allocated_capacity + 1);
          }
          if (local_188._M_p != local_1a8 + 0x30) {
            operator_delete(local_188._M_p,local_178._M_allocated_capacity + 1);
          }
          if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a8._0_8_ !=
              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1a8 + 0x10)) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
          pVar15 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::_M_get_insert_equal_pos(&this_00->_M_t,__k);
          local_1a8._0_8_ = this_00;
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::
          _M_insert_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)this_00,pVar15.first,pVar15.second,__k,(_Alloc_node *)local_1a8);
          std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::emplace_back<tinyusdz::Prim>
                    (&this->_root_nodes,prim);
          goto LAB_002402c7;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                   ,0x4f);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"replace_root_prim",0x11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        iVar7 = 0x2e5;
      }
      else {
        if (bVar6) {
          local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"");
          Path::Path((Path *)local_1a8,local_1f8,&local_220);
          Path::operator=(&prim->_elementPath,(Path *)local_1a8);
          if (local_108._M_p != local_1a8 + 0xb0) {
            operator_delete(local_108._M_p,local_f8[0]._M_allocated_capacity + 1);
          }
          if (local_128._M_p != local_1a8 + 0x90) {
            operator_delete(local_128._M_p,local_118._M_allocated_capacity + 1);
          }
          if (local_148._M_p != local_1a8 + 0x70) {
            operator_delete(local_148._M_p,local_138._M_allocated_capacity + 1);
          }
          if (local_168._M_p != local_1a8 + 0x50) {
            operator_delete(local_168._M_p,local_158._M_allocated_capacity + 1);
          }
          if (local_188._M_p != local_1a8 + 0x30) {
            operator_delete(local_188._M_p,local_178._M_allocated_capacity + 1);
          }
          if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a8._0_8_ !=
              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1a8 + 0x10)) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
          Path::operator=(&pPVar12->_abs_path,&prim->_abs_path);
          Path::operator=(&pPVar12->_path,&prim->_path);
          Path::operator=(&pPVar12->_elementPath,&prim->_elementPath);
          std::__cxx11::string::operator=
                    ((string *)&pPVar12->_prim_type_name,(string *)&prim->_prim_type_name);
          pPVar12->_specifier = prim->_specifier;
          linb::any::operator=(&(pPVar12->_data).v_,&(prim->_data).v_);
          std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::_M_move_assign
                    (&pPVar12->_children,&prim->_children);
          std::
          multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&pPVar12->_childrenNameSet,&prim->_childrenNameSet);
          bVar6 = prim->_primChildrenIndicesIsValid;
          pPVar12->_child_dirty = prim->_child_dirty;
          pPVar12->_primChildrenIndicesIsValid = bVar6;
          std::vector<long,_std::allocator<long>_>::_M_move_assign
                    (&pPVar12->_primChildrenIndices,&prim->_primChildrenIndices);
          pPVar12->_prim_id = prim->_prim_id;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
          ::operator=(&pPVar12->_variantSets,&prim->_variantSets);
LAB_002402c7:
          this->_dirty = true;
          return true;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                   ,0x4f);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"replace_root_prim",0x11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        iVar7 = 0x2db;
      }
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Internal error. cannot modify Prim\'s elementName.",0x31);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_220._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p == &local_220.field_2) goto LAB_0023f861;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc",
                 0x4f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"replace_root_prim",0x11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar9 = (ostream *)std::ostream::operator<<((ostringstream *)local_1a8,0x2bf);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f0,"`{}` is not a valid Prim name.","");
      fmt::format<std::__cxx11::string>(&local_220,(fmt *)&local_1f0,prim_name,in_RCX);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_220._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p == &local_220.field_2) goto LAB_0023f861;
    }
  }
  operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
LAB_0023f861:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return false;
}

Assistant:

bool Stage::replace_root_prim(const std::string &prim_name, Prim &&prim) {

#if defined(TINYUSDZ_ENABLE_THREAD)
  // TODO: Only take a lock when dirty.
  std::lock_guard<std::mutex> lock(_mutex);
#endif

  if (prim_name.empty()) {
    PUSH_ERROR_AND_RETURN(fmt::format("prim_name is empty."));
  }

  if (!ValidatePrimElementName(prim_name)) {
    PUSH_ERROR_AND_RETURN(fmt::format("`{}` is not a valid Prim name.", prim_name));
  }

  if (_root_nodes.size() != _root_node_nameSet.size()) {
    // Rebuild nameSet
    _root_node_nameSet.clear();
    for (size_t i = 0; i < _root_nodes.size(); i++) {
      if (_root_nodes[i].element_name().empty()) {
        PUSH_ERROR_AND_RETURN("Internal error: Existing root Prim's elementName is empty.");
      }

      if (_root_node_nameSet.count(_root_nodes[i].element_name())) {
        PUSH_ERROR_AND_RETURN("Internal error: Stage contains root Prim with same elementName.");
      }

      _root_node_nameSet.insert(_root_nodes[i].element_name());
    }
  }

  // Simple linear scan
  auto result = std::find_if(_root_nodes.begin(), _root_nodes.end(), [prim_name](const Prim &p) {
    return (p.element_name() == prim_name);
  });

  if (result != _root_nodes.end()) {

    // Need to modify both Prim::data::name and Prim::elementPath
    if (!SetPrimElementName(prim.get_data(), prim_name)) {
      PUSH_ERROR_AND_RETURN("Internal error. cannot modify Prim's elementName.");
    }
    prim.element_path() = Path(prim_name, /* prop_part */"");

    (*result) = std::move(prim); // replace

  } else {

    // Need to modify both Prim::data::name and Prim::elementPath
    if (!SetPrimElementName(prim.get_data(), prim_name)) {
      PUSH_ERROR_AND_RETURN("Internal error. cannot modify Prim's elementName.");
    }
    prim.element_path() = Path(prim_name, /* prop_part */"");

    _root_node_nameSet.insert(prim_name);
    _root_nodes.emplace_back(std::move(prim)); // add
  }

  _dirty = true;

  return true;
}